

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf::bone_motion_io::insert_key(bone_motion_io *this,float time,ogf_key_qr *value)

{
  undefined1 local_d8 [8];
  dvector3 r;
  dmatrix xform;
  dquaternion q;
  ogf_key_qr *value_local;
  float time_local;
  bone_motion_io *this_local;
  
  ogf_key_qr::dequantize<double>(value,(_quaternion<double> *)((long)&xform.field_0 + 0x78));
  _matrix<double>::rotation
            ((_matrix<double> *)((long)&r.field_0 + 0x10),
             (_quaternion<double> *)((long)&xform.field_0 + 0x78));
  _matrix<double>::get_xyz_i
            ((_matrix<double> *)((long)&r.field_0 + 0x10),(_vector3<double> *)local_d8);
  xr_envelope::insert_key((this->super_xr_bone_motion).m_envelopes[4],time,(float)(double)local_d8);
  xr_envelope::insert_key
            ((this->super_xr_bone_motion).m_envelopes[3],time,(float)r.field_0.field_0.x);
  xr_envelope::insert_key
            ((this->super_xr_bone_motion).m_envelopes[5],time,(float)r.field_0.field_0.y);
  return;
}

Assistant:

void xr_ogf::bone_motion_io::insert_key(float time, const ogf_key_qr* value)
{
	dquaternion q;
	value->dequantize(q);
	dmatrix xform;
	xform.rotation(q);
	dvector3 r;
	xform.get_xyz_i(r);
	m_envelopes[4]->insert_key(time, float(r.x));
	m_envelopes[3]->insert_key(time, float(r.y));
	m_envelopes[5]->insert_key(time, float(r.z));
}